

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O3

void Abc_NodeFreeNames(Vec_Ptr_t *vNames)

{
  int iVar1;
  long lVar2;
  
  if (vNames != (Vec_Ptr_t *)0x0) {
    iVar1 = vNames->nSize;
    if (0 < iVar1) {
      lVar2 = 0;
      do {
        if (vNames->pArray[lVar2] != (void *)0x0) {
          free(vNames->pArray[lVar2]);
          vNames->pArray[lVar2] = (void *)0x0;
          iVar1 = vNames->nSize;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < iVar1);
    }
    if (vNames->pArray != (void **)0x0) {
      free(vNames->pArray);
    }
    free(vNames);
    return;
  }
  return;
}

Assistant:

void Abc_NodeFreeNames( Vec_Ptr_t * vNames )
{
    int i;
    if ( vNames == NULL )
        return;
    for ( i = 0; i < vNames->nSize; i++ )
        ABC_FREE( vNames->pArray[i] );
    Vec_PtrFree( vNames );
}